

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

InstanceNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceNameSyntax,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>const&>
          (BumpAllocator *this,Token *args,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_1)

{
  size_type sVar1;
  pointer ppVVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  InstanceNameSyntax *pIVar10;
  long lVar11;
  
  pIVar10 = (InstanceNameSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InstanceNameSyntax *)this->endPtr < pIVar10 + 1) {
    pIVar10 = (InstanceNameSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pIVar10 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar3 = args->info;
  (pIVar10->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pIVar10->super_SyntaxNode).kind = InstanceName;
  (pIVar10->name).kind = TVar4;
  (pIVar10->name).field_0x2 = uVar5;
  (pIVar10->name).numFlags = (NumericTokenFlags)NVar6.raw;
  (pIVar10->name).rawLen = uVar7;
  (pIVar10->name).info = pIVar3;
  SVar8 = (args_1->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args_1->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pIVar10->dimensions).super_SyntaxListBase.super_SyntaxNode.parent =
       (args_1->super_SyntaxListBase).super_SyntaxNode.parent;
  (pIVar10->dimensions).super_SyntaxListBase.super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pIVar10->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar9;
  (pIVar10->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (pIVar10->dimensions).super_SyntaxListBase.childCount = (args_1->super_SyntaxListBase).childCount;
  sVar1 = (args_1->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
          size_;
  (pIVar10->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
  .data_ = (args_1->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
           data_;
  (pIVar10->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
  .size_ = sVar1;
  (pIVar10->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea278;
  (pIVar10->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = &pIVar10->super_SyntaxNode;
  sVar1 = (pIVar10->dimensions).
          super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppVVar2 = (pIVar10->dimensions).
              super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.data_;
    lVar11 = 0;
    do {
      **(undefined8 **)((long)ppVVar2 + lVar11) = pIVar10;
      lVar11 = lVar11 + 8;
    } while (sVar1 << 3 != lVar11);
  }
  return pIVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }